

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O0

GLFWvkproc glfwGetInstanceProcAddress(VkInstance instance,char *procname)

{
  GLFWbool GVar1;
  int iVar2;
  PFN_vkVoidFunction local_28;
  GLFWvkproc proc;
  char *procname_local;
  VkInstance instance_local;
  
  if (procname == (char *)0x0) {
    __assert_fail("procname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/vulkan.c",
                  0xfc,"GLFWvkproc glfwGetInstanceProcAddress(VkInstance, const char *)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    instance_local = (VkInstance)0x0;
  }
  else {
    GVar1 = _glfwInitVulkan(2);
    if (GVar1 == 0) {
      instance_local = (VkInstance)0x0;
    }
    else {
      iVar2 = strcmp(procname,"vkGetInstanceProcAddr");
      if (iVar2 == 0) {
        instance_local = _glfw.vk.GetInstanceProcAddr;
      }
      else {
        local_28 = (*_glfw.vk.GetInstanceProcAddr)(instance,procname);
        if ((local_28 == (PFN_vkVoidFunction)0x0) && (_glfw.vk.handle != (void *)0x0)) {
          local_28 = _glfwPlatformGetModuleSymbol(_glfw.vk.handle,procname);
        }
        instance_local = local_28;
      }
    }
  }
  return (GLFWvkproc)instance_local;
}

Assistant:

GLFWAPI GLFWvkproc glfwGetInstanceProcAddress(VkInstance instance,
                                              const char* procname)
{
    GLFWvkproc proc;
    assert(procname != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return NULL;

    // NOTE: Vulkan 1.0 and 1.1 vkGetInstanceProcAddr cannot return itself
    if (strcmp(procname, "vkGetInstanceProcAddr") == 0)
        return (GLFWvkproc) vkGetInstanceProcAddr;

    proc = (GLFWvkproc) vkGetInstanceProcAddr(instance, procname);
    if (!proc)
    {
        if (_glfw.vk.handle)
            proc = (GLFWvkproc) _glfwPlatformGetModuleSymbol(_glfw.vk.handle, procname);
    }

    return proc;
}